

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t COVER_buildDictionary
                 (COVER_ctx_t *ctx,U32 *freqs,COVER_map_t *activeDmers,void *dictBuffer,
                 size_t dictBufferCapacity,ZDICT_cover_params_t parameters)

{
  uint *puVar1;
  uint uVar2;
  COVER_map_pair_t *pCVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  COVER_epoch_info_t CVar7;
  ulong uVar8;
  U32 *pUVar9;
  ulong uVar10;
  clock_t cVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  COVER_map_pair_t *pCVar17;
  U32 in_R9D;
  U32 UVar18;
  ulong uVar19;
  COVER_map_pair_t *pCVar20;
  ulong uVar21;
  ulong uVar22;
  size_t sVar23;
  uint local_b4;
  
  CVar7 = COVER_computeEpochs((U32)dictBufferCapacity,(U32)ctx->suffixSize,in_R9D,4);
  uVar5 = (uint)((ulong)CVar7 >> 3) & 0x1fffffff;
  uVar15 = 100;
  if (uVar5 < 100) {
    uVar15 = uVar5;
  }
  uVar8 = 10;
  if (0x4f < CVar7.num) {
    uVar8 = (ulong)uVar15;
  }
  if (1 < g_displayLevel) {
    COVER_buildDictionary_cold_1();
  }
  if (dictBufferCapacity == 0) {
    sVar23 = 0;
  }
  else {
    uVar12 = 0;
    uVar14 = 0;
    do {
      uVar22 = uVar14 * ((ulong)CVar7 >> 0x20);
      uVar15 = (uint)uVar22 + CVar7.size;
      memset(activeDmers->data,0xff,(ulong)activeDmers->size << 3);
      sVar23 = dictBufferCapacity;
      if ((uint)uVar22 < uVar15) {
        uVar21 = uVar22 & 0xffffffff;
        uVar19 = 0;
        uVar13 = 0;
        local_b4 = 0;
        uVar5 = 0;
        do {
          uVar2 = ctx->dmerAt[uVar21];
          pUVar9 = COVER_map_at(activeDmers,uVar2);
          if (*pUVar9 == 0) {
            local_b4 = local_b4 + freqs[uVar2];
          }
          uVar21 = uVar21 + 1;
          *pUVar9 = *pUVar9 + 1;
          if ((int)uVar21 - (int)uVar22 == (in_R9D - parameters.k) + 2) {
            uVar2 = ctx->dmerAt[uVar22 & 0xffffffff];
            pUVar9 = COVER_map_at(activeDmers,uVar2);
            uVar22 = (ulong)((int)uVar22 + 1);
            *pUVar9 = *pUVar9 - 1;
            if (*pUVar9 == 0) {
              cVar4 = (char)activeDmers->sizeLog;
              uVar10 = (ulong)(uVar2 * -0x61c8864f >> (-cVar4 & 0x1fU));
              pCVar3 = activeDmers->data;
              if (pCVar3[uVar10].value != 0xffffffff) {
                pCVar17 = pCVar3 + uVar10;
LAB_001856cf:
                if (pCVar17->key != uVar2) goto code_r0x001856d4;
                pCVar17 = pCVar3 + uVar10;
                uVar6 = activeDmers->sizeMask;
                uVar10 = (ulong)((int)uVar10 + 1U & uVar6);
                UVar18 = pCVar3[uVar10].value;
                if (UVar18 != 0xffffffff) {
                  pCVar20 = pCVar3 + uVar10;
                  uVar16 = 1;
                  do {
                    if (((int)uVar10 - (pCVar20->key * -0x61c8864f >> (0x20U - cVar4 & 0x1f)) &
                        uVar6) < uVar16) {
                      uVar16 = uVar16 + 1;
                    }
                    else {
                      pCVar17->key = pCVar20->key;
                      pCVar17->value = UVar18;
                      uVar16 = 1;
                      pCVar17 = pCVar20;
                    }
                    uVar10 = (ulong)((int)uVar10 + 1U & uVar6);
                    pCVar20 = pCVar3 + uVar10;
                    UVar18 = pCVar20->value;
                  } while (UVar18 != 0xffffffff);
                }
                pCVar17->value = 0xffffffff;
              }
LAB_00185763:
              local_b4 = local_b4 - freqs[uVar2];
            }
          }
          uVar10 = uVar13;
          uVar2 = uVar5;
          if (uVar5 < local_b4) {
            uVar10 = uVar21;
            uVar2 = local_b4;
          }
          uVar13 = uVar10 & 0xffffffff;
          uVar6 = (uint)uVar10;
          if (uVar5 < local_b4) {
            uVar19 = uVar22 & 0xffffffff;
          }
          uVar5 = uVar2;
        } while (uVar21 != uVar15);
        uVar15 = uVar6;
        if ((uint)uVar19 != uVar6) {
          pUVar9 = ctx->dmerAt;
          uVar10 = uVar10 & 0xffffffff;
          uVar22 = uVar19;
          do {
            uVar13 = uVar10;
            if ((uint)uVar22 <= (uint)uVar10) {
              uVar13 = uVar22;
            }
            puVar1 = pUVar9 + uVar22;
            uVar15 = (uint)uVar22 + 1;
            uVar22 = (ulong)uVar15;
            if (freqs[*puVar1] != 0) {
              uVar10 = uVar13;
            }
            uVar5 = (uint)uVar10;
            if (freqs[*puVar1] != 0) {
              uVar19 = uVar22;
            }
          } while (uVar6 != uVar15);
          uVar22 = uVar10;
          uVar16 = uVar5;
          while (uVar6 = uVar5, uVar15 = (uint)uVar22, uVar16 != (uint)uVar19) {
            freqs[pUVar9[uVar10]] = 0;
            uVar16 = (int)uVar10 + 1;
            uVar10 = (ulong)uVar16;
            uVar22 = uVar19;
          }
        }
        if (uVar2 == 0) goto LAB_00185875;
        uVar12 = (ulong)((uVar15 + (parameters.k - 1)) - uVar6);
        if (dictBufferCapacity < uVar12) {
          uVar12 = dictBufferCapacity;
        }
        if (uVar12 < parameters.k) break;
        dictBufferCapacity = dictBufferCapacity - uVar12;
        memcpy((void *)((long)dictBuffer + dictBufferCapacity),ctx->samples + uVar6,uVar12);
        if ((1 < g_displayLevel) &&
           ((cVar11 = clock(), 150000 < cVar11 - g_time || (3 < g_displayLevel)))) {
          COVER_buildDictionary_cold_2();
        }
        uVar12 = 0;
      }
      else {
LAB_00185875:
        uVar12 = uVar12 + 1;
        if (uVar8 <= uVar12) break;
      }
      uVar14 = (uVar14 + 1) % ((ulong)CVar7 & 0xffffffff);
      sVar23 = 0;
    } while (dictBufferCapacity != 0);
  }
  if (1 < g_displayLevel) {
    COVER_buildDictionary_cold_3();
  }
  return sVar23;
code_r0x001856d4:
  uVar10 = (ulong)((int)uVar10 + 1U & activeDmers->sizeMask);
  pCVar17 = pCVar3 + uVar10;
  if (pCVar17->value == 0xffffffff) goto LAB_00185763;
  goto LAB_001856cf;
}

Assistant:

static size_t COVER_buildDictionary(const COVER_ctx_t *ctx, U32 *freqs,
                                    COVER_map_t *activeDmers, void *dictBuffer,
                                    size_t dictBufferCapacity,
                                    ZDICT_cover_params_t parameters) {
  BYTE *const dict = (BYTE *)dictBuffer;
  size_t tail = dictBufferCapacity;
  /* Divide the data into epochs. We will select one segment from each epoch. */
  const COVER_epoch_info_t epochs = COVER_computeEpochs(
      (U32)dictBufferCapacity, (U32)ctx->suffixSize, parameters.k, 4);
  const size_t maxZeroScoreRun = MAX(10, MIN(100, epochs.num >> 3));
  size_t zeroScoreRun = 0;
  size_t epoch;
  DISPLAYLEVEL(2, "Breaking content into %u epochs of size %u\n",
                (U32)epochs.num, (U32)epochs.size);
  /* Loop through the epochs until there are no more segments or the dictionary
   * is full.
   */
  for (epoch = 0; tail > 0; epoch = (epoch + 1) % epochs.num) {
    const U32 epochBegin = (U32)(epoch * epochs.size);
    const U32 epochEnd = epochBegin + epochs.size;
    size_t segmentSize;
    /* Select a segment */
    COVER_segment_t segment = COVER_selectSegment(
        ctx, freqs, activeDmers, epochBegin, epochEnd, parameters);
    /* If the segment covers no dmers, then we are out of content.
     * There may be new content in other epochs, for continue for some time.
     */
    if (segment.score == 0) {
      if (++zeroScoreRun >= maxZeroScoreRun) {
          break;
      }
      continue;
    }
    zeroScoreRun = 0;
    /* Trim the segment if necessary and if it is too small then we are done */
    segmentSize = MIN(segment.end - segment.begin + parameters.d - 1, tail);
    if (segmentSize < parameters.d) {
      break;
    }
    /* We fill the dictionary from the back to allow the best segments to be
     * referenced with the smallest offsets.
     */
    tail -= segmentSize;
    memcpy(dict + tail, ctx->samples + segment.begin, segmentSize);
    DISPLAYUPDATE(
        2, "\r%u%%       ",
        (unsigned)(((dictBufferCapacity - tail) * 100) / dictBufferCapacity));
  }
  DISPLAYLEVEL(2, "\r%79s\r", "");
  return tail;
}